

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Route.cpp
# Opt level: O1

vector<int,_std::allocator<int>_> * __thiscall
Route::getRoutePOIs(vector<int,_std::allocator<int>_> *__return_storage_ptr__,Route *this)

{
  pointer ppVar1;
  iterator __position;
  pointer ppVar2;
  pair<int,_double> dp;
  undefined8 local_38;
  double dStack_30;
  
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ppVar1 = (this->route).
           super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (ppVar2 = (this->route).
                super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                ._M_impl.super__Vector_impl_data._M_start; ppVar2 != ppVar1; ppVar2 = ppVar2 + 1) {
    local_38 = *(undefined8 *)ppVar2;
    dStack_30 = ppVar2->second;
    __position._M_current =
         (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                ((vector<int,std::allocator<int>> *)__return_storage_ptr__,__position,
                 (int *)&local_38);
    }
    else {
      *__position._M_current = (int)local_38;
      (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
      super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

vector<int> Route::getRoutePOIs() const {
    vector<int> POIs;
    for (auto dp : route) {
        POIs.push_back(dp.first);
    }
    return POIs;
}